

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O3

int ARKStepResFtolerance(void *arkode_mem,ARKRwtFn rfun)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::ARKStep","ARKStepResFtolerance",
                    "arkode_mem = NULL illegal.");
    return -0x15;
  }
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar1 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
  }
  else {
    if (*(int *)((long)arkode_mem + 0x250) != 0) {
      if (*(int *)((long)arkode_mem + 0x100) != 0) {
        *(undefined8 *)((long)arkode_mem + 0xf8) = 0;
        iVar1 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0xf0),
                            (N_Vector *)((long)arkode_mem + 0xf8));
        if (iVar1 == 0) {
          arkProcessError((ARKodeMem)arkode_mem,-0x14,"ARKode","arkResFtolerances",
                          "Allocation of arkode_mem failed.");
          return -0x16;
        }
        *(undefined4 *)((long)arkode_mem + 0x100) = 0;
      }
      *(undefined4 *)((long)arkode_mem + 0x1c) = 2;
      *(undefined4 *)((long)arkode_mem + 0x68) = 1;
      *(ARKRwtFn *)((long)arkode_mem + 0x70) = rfun;
      *(undefined8 *)((long)arkode_mem + 0x78) = *(undefined8 *)((long)arkode_mem + 0x10);
      return 0;
    }
    msgfmt = "Attempt to call before ARKodeInit.";
    iVar1 = -0x17;
    error_code = -0x17;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,"ARKode","arkResFtolerances",msgfmt);
  return iVar1;
}

Assistant:

int ARKStepResFtolerance(void *arkode_mem, ARKRwtFn rfun)
{
  /* unpack ark_mem, call arkResFtolerance, and return */
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ARKStep",
                    "ARKStepResFtolerance", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  return(arkResFtolerance(ark_mem, rfun));
}